

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyValueValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  JSAtom prop_00;
  int iVar1;
  
  prop_00 = JS_ValueToAtom(ctx,prop);
  JS_FreeValue(ctx,prop);
  if (prop_00 == 0) {
    JS_FreeValue(ctx,val);
    iVar1 = -1;
  }
  else {
    iVar1 = JS_DefinePropertyValue(ctx,this_obj,prop_00,val,flags);
    JS_FreeAtom(ctx,prop_00);
  }
  return iVar1;
}

Assistant:

int JS_DefinePropertyValueValue(JSContext *ctx, JSValueConst this_obj,
                                JSValue prop, JSValue val, int flags)
{
    JSAtom atom;
    int ret;
    atom = JS_ValueToAtom(ctx, prop);
    JS_FreeValue(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    ret = JS_DefinePropertyValue(ctx, this_obj, atom, val, flags);
    JS_FreeAtom(ctx, atom);
    return ret;
}